

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_2c0f7::ParseDummyTool::createCommand(ParseDummyTool *this,StringRef name)

{
  ulong uVar1;
  undefined8 uVar2;
  Tool *this_00;
  unique_ptr<(anonymous_namespace)::ParseDummyCommand,_std::default_delete<(anonymous_namespace)::ParseDummyCommand>_>
  local_80;
  StringRef local_78;
  string local_68;
  string local_48;
  Tool *local_28;
  ParseDummyTool *this_local;
  StringRef name_local;
  
  this_local = (ParseDummyTool *)name.Length;
  this_00 = (Tool *)name.Data;
  local_28 = this_00;
  name_local.Length = (size_t)this;
  uVar1 = (**(code **)(*this_00[1]._vptr_Tool + 0x68))();
  if ((uVar1 & 1) != 0) {
    llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)&this_local);
    uVar2 = std::__cxx11::string::c_str();
    printf("command(\'%s\')\n",uVar2);
    std::__cxx11::string::~string((string *)&local_48);
    local_78 = llbuild::buildsystem::Tool::getName(this_00);
    llvm::StringRef::str_abi_cxx11_(&local_68,&local_78);
    uVar2 = std::__cxx11::string::c_str();
    printf("  -- \'tool\': \'%s\')\n",uVar2);
    std::__cxx11::string::~string((string *)&local_68);
  }
  llvm::
  make_unique<(anonymous_namespace)::ParseDummyCommand,(anonymous_namespace)::ParseBuildFileDelegate&,llvm::StringRef&>
            ((llvm *)&local_80,(ParseBuildFileDelegate *)this_00[1]._vptr_Tool,
             (StringRef *)&this_local);
  std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
  ::
  unique_ptr<(anonymous_namespace)::ParseDummyCommand,std::default_delete<(anonymous_namespace)::ParseDummyCommand>,void>
            ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
              *)this,&local_80);
  std::
  unique_ptr<(anonymous_namespace)::ParseDummyCommand,_std::default_delete<(anonymous_namespace)::ParseDummyCommand>_>
  ::~unique_ptr(&local_80);
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(
      StringRef name) override {
    if (delegate.shouldShowOutput()) {
      printf("command('%s')\n", name.str().c_str());
      printf("  -- 'tool': '%s')\n", getName().str().c_str());
    }

    return llvm::make_unique<ParseDummyCommand>(delegate, name);
  }